

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O0

void booster::aio::details::add<booster::aio::const_buffer>(const_buffer *left,const_buffer *right)

{
  size_t in_RSI;
  char *in_RDI;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar1;
  uint i;
  buffer_impl<const_char_*> *unaff_retaddr;
  buffer_data_type data;
  undefined4 local_24;
  undefined8 local_18;
  
  pVar1 = buffer_impl<const_char_*>::get(unaff_retaddr);
  for (local_24 = 0; local_18 = pVar1.second, local_24 < local_18; local_24 = local_24 + 1) {
    buffer_impl<const_char_*>::add(unaff_retaddr,in_RDI,in_RSI);
  }
  return;
}

Assistant:

void add(Buffer &left,Buffer const &right)
			{
				typename Buffer::buffer_data_type data=right.get();
				for(unsigned i=0;i<data.second;i++)
					left.add(data.first[i].ptr,data.first[i].size);
			}